

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O1

string * __thiscall
Omega_h::ExprEnv::string_abi_cxx11_(string *__return_storage_ptr__,ExprEnv *this,int verbose)

{
  _Rb_tree_header *p_Var1;
  ExprEnv *pEVar2;
  string *psVar3;
  bool bVar4;
  ostream *poVar5;
  _Base_ptr p_Var6;
  undefined8 *puVar7;
  string sep;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
  i;
  any v;
  string str;
  ostringstream oss;
  ostringstream vs;
  long *local_3c0;
  char *local_3b8;
  long local_3b0 [2];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
  local_3a0;
  storage_union local_368;
  vtable_type *local_358;
  long *local_350;
  long local_348;
  long local_340 [2];
  ExprEnv *local_330;
  string *local_328;
  ostringstream local_320 [112];
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_320);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  local_3c0 = local_3b0;
  local_328 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"");
  p_Var6 = (this->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->variables)._M_t._M_impl.super__Rb_tree_header;
  local_330 = this;
  if ((_Rb_tree_header *)p_Var6 != p_Var1) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
      ::pair(&local_3a0,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>
              *)(p_Var6 + 1));
      local_358 = local_3a0.second.vtable;
      if (local_3a0.second.vtable != (vtable_type *)0x0) {
        (*(local_3a0.second.vtable)->copy)(&local_3a0.second.storage,&local_368);
      }
      bVar4 = any::is_typed((any *)&local_368,(type_info *)&std::__cxx11::string::typeinfo);
      if (!bVar4 || (long *)local_368.dynamic == (long *)0x0) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = &PTR__bad_cast_004c4678;
        __cxa_throw(puVar7,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_350 = local_340;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_350,*local_368.dynamic,
                 *(long *)((long)local_368.dynamic + 8) + *local_368.dynamic);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_3c0,(long)local_3b8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_3a0.first._M_dataplus._M_p,local_3a0.first._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," : ",3);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)local_350,local_348);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
      std::__cxx11::string::_M_replace((ulong)&local_3c0,0,local_3b8,0x45575d);
      if (local_350 != local_340) {
        operator_delete(local_350,local_340[0] + 1);
      }
      if (local_358 != (vtable_type *)0x0) {
        (*local_358->destroy)(&local_368);
        local_358 = (vtable_type *)0x0;
      }
      if (local_3a0.second.vtable != (vtable_type *)0x0) {
        (*(local_3a0.second.vtable)->destroy)(&local_3a0.second.storage);
        local_3a0.second.vtable = (vtable_type *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a0.first._M_dataplus._M_p != &local_3a0.first.field_2) {
        operator_delete(local_3a0.first._M_dataplus._M_p,
                        local_3a0.first.field_2._M_allocated_capacity + 1);
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"ExprEnv:",8);
  psVar3 = local_328;
  pEVar2 = local_330;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n  size      = ",0xf);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_320,pEVar2->size);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n  dim       = ",0xf);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)poVar5,pEVar2->dim);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n  variables = ",0xf);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,local_3a0.first._M_dataplus._M_p,local_3a0.first._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0.first._M_dataplus._M_p != &local_3a0.first.field_2) {
    operator_delete(local_3a0.first._M_dataplus._M_p,
                    local_3a0.first.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0,local_3b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream(local_320);
  std::ios_base::~ios_base(local_2b0);
  return psVar3;
}

Assistant:

std::string ExprEnv::string(int verbose) {
  //std::map<std::string, any> variables;
  //std::map<std::string, Function> functions;
  //LO size;
  //Int dim;
  std::ostringstream oss, vs;
  std::string sep = "";
  for(auto i : variables) {
    auto v = i.second;
    std::string str = any_cast<std::string>(v);
    vs << sep << "{" << i.first << " : " << str << "}";
    sep = " ";
  }
  oss << "ExprEnv:"
      << "\n  size      = " << size
      << "\n  dim       = " << dim
      << "\n  variables = " << vs.str();
  (void)verbose;
  return oss.str();
}